

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

void duckdb::Node48::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  data_t dVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  long lVar5;
  type paVar6;
  long *plVar7;
  pointer this;
  data_ptr_t pdVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  Node node48;
  IndexPointer local_38;
  
  uVar2 = (node->super_IndexPointer).data;
  paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar6->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar2 & 0xffffffff;
  plVar7 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar7; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar7 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar7 + 0x10));
  pdVar8 = FixedSizeBuffer::Get(this,true);
  lVar11 = (ulong)((uint)(uVar2 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  lVar5 = iVar4 + lVar11;
  Node::Free(art,(Node *)(pdVar8 + (ulong)pdVar8[(ulong)byte + 1 + lVar5] * 8 + 0x108 + lVar5));
  pdVar8[(ulong)byte + 1 + lVar5] = '0';
  dVar1 = pdVar8[iVar4 + lVar11];
  pdVar8[iVar4 + lVar11] = dVar1 - 1;
  if ((byte)(dVar1 - 1) < 0xc) {
    local_38.data = (node->super_IndexPointer).data;
    Node16::ShrinkNode48(art,node,(Node *)&local_38);
  }
  return;
}

Assistant:

void Node48::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// Free the child and decrease the count.
	Node::Free(art, n48.children[n48.child_index[byte]]);
	n48.child_index[byte] = EMPTY_MARKER;
	n48.count--;

	// Shrink to Node16.
	if (n48.count < SHRINK_THRESHOLD) {
		auto node48 = node;
		Node16::ShrinkNode48(art, node, node48);
	}
}